

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void common_init::anon_class_1_0_00000001::__invoke(ggml_log_level level,char *text,void *param_3)

{
  undefined8 in_RDX;
  anon_class_1_0_00000001 *in_RSI;
  void *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  operator()(in_RSI,(ggml_log_level)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffffe0,
             in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void common_init() {
    llama_log_set([](ggml_log_level level, const char * text, void * /*user_data*/) {
        if (LOG_DEFAULT_LLAMA <= common_log_verbosity_thold) {
            common_log_add(common_log_main(), level, "%s", text);
        }
    }, NULL);

#ifdef NDEBUG
    const char * build_type = "";
#else
    const char * build_type = " (debug)";
#endif

    LOG_INF("build: %d (%s) with %s for %s%s\n", LLAMA_BUILD_NUMBER, LLAMA_COMMIT, LLAMA_COMPILER, LLAMA_BUILD_TARGET, build_type);
}